

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

void wallet::RescanWallet
               (CWallet *wallet,WalletRescanReserver *reserver,int64_t time_begin,bool update)

{
  long lVar1;
  undefined1 update_00;
  bool bVar2;
  string *message;
  undefined8 uVar3;
  byte in_CL;
  WalletRescanReserver *in_RDX;
  int64_t in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  int64_t scanned_time;
  CWallet *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  update_00 = in_CL & 1;
  message = (string *)CWallet::RescanFromTime(in_RDI,in_RSI,in_RDX,(bool)update_00);
  bVar2 = CWallet::IsAbortingRescan(in_stack_ffffffffffffff48);
  if (bVar2) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
               (char *)CONCAT17(update_00,in_stack_ffffffffffffff90),(allocator<char> *)message);
    JSONRPCError((int)((ulong)in_RDX >> 0x20),message);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if ((long)in_RDX < (long)message) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
               (char *)CONCAT17(update_00,in_stack_ffffffffffffff90),(allocator<char> *)message);
    JSONRPCError((int)((ulong)in_RDX >> 0x20),message);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void RescanWallet(CWallet& wallet, const WalletRescanReserver& reserver, int64_t time_begin = TIMESTAMP_MIN, bool update = true)
{
    int64_t scanned_time = wallet.RescanFromTime(time_begin, reserver, update);
    if (wallet.IsAbortingRescan()) {
        throw JSONRPCError(RPC_MISC_ERROR, "Rescan aborted by user.");
    } else if (scanned_time > time_begin) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Rescan was unable to fully rescan the blockchain. Some transactions may be missing.");
    }
}